

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O0

int __thiscall
helics::zeromq::ZmqCommsSS::processRxMessage
          (ZmqCommsSS *this,socket_t *socket,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *connection_info)

{
  int iVar1;
  ActionMessage *this_00;
  size_t sVar2;
  size_t in_RCX;
  ActionMessage *in_RSI;
  int in_R8D;
  ActionMessage rep;
  message_t msg2;
  message_t msg1;
  int status;
  ActionMessage *in_stack_fffffffffffffdd0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  action_t in_stack_fffffffffffffdec;
  ActionMessage *in_stack_fffffffffffffdf0;
  ActionMessage *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  size_t local_198;
  undefined4 local_184;
  size_t local_d0;
  size_t local_c0;
  undefined1 local_a0 [64];
  undefined1 local_60 [68];
  int local_1c;
  ActionMessage *local_10;
  
  local_1c = 0;
  local_10 = in_RSI;
  zmq::message_t::message_t((message_t *)in_stack_fffffffffffffdd0);
  zmq::message_t::message_t((message_t *)in_stack_fffffffffffffdd0);
  local_c0 = zmq::detail::socket_base::recv
                       ((socket_base *)local_10,(int)local_60,(void *)0x0,in_RCX,in_R8D);
  sVar2 = zmq::detail::socket_base::recv
                    ((socket_base *)local_10,(int)local_a0,(void *)0x0,local_c0,in_R8D);
  local_d0 = sVar2;
  local_1c = processIncomingMessage
                       ((ZmqCommsSS *)rep.payload.buffer._M_elems._8_8_,
                        (message_t *)rep.payload.buffer._M_elems._0_8_,
                        (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)rep.Tso.internalTimeCode);
  if (local_1c == 3) {
    ActionMessage::ActionMessage(in_stack_fffffffffffffdf0,in_stack_fffffffffffffdec);
    local_184 = 0x130;
    sVar2 = zmq::detail::socket_base::send
                      ((socket_base *)local_10,(int)local_60,(void *)0x2,sVar2,in_R8D);
    this_00 = local_10;
    this_01 = &local_1b8;
    local_198 = sVar2;
    std::__cxx11::string::string(this_01);
    zmq::detail::socket_base::send((socket_base *)this_00,(int)this_01,(void *)0x2,sVar2,in_R8D);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdd0);
    ActionMessage::to_string_abi_cxx11_(in_stack_fffffffffffffe28);
    zmq::detail::socket_base::send
              ((socket_base *)local_10,(int)&stack0xfffffffffffffe28,(void *)0x1,sVar2,in_R8D);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_10);
    local_1c = 0;
    ActionMessage::~ActionMessage(local_10);
    in_stack_fffffffffffffdd0 = local_10;
  }
  iVar1 = local_1c;
  zmq::message_t::~message_t((message_t *)in_stack_fffffffffffffdd0);
  zmq::message_t::~message_t((message_t *)in_stack_fffffffffffffdd0);
  return iVar1;
}

Assistant:

int ZmqCommsSS::processRxMessage(zmq::socket_t& socket,
                                 std::map<std::string, std::string>& connection_info)
{
    int status = 0;
    zmq::message_t msg1;
    zmq::message_t msg2;

    socket.recv(msg1);
    socket.recv(msg2);
    status = processIncomingMessage(msg2, connection_info);

    if (status == 3) {
        ActionMessage rep(CMD_PROTOCOL);
        rep.messageID = CONNECTION_ACK;
        socket.send(msg1, zmq::send_flags::sndmore);
        socket.send(std::string{}, zmq::send_flags::sndmore);
        socket.send(rep.to_string(), zmq::send_flags::dontwait);
        status = 0;
    }
    return status;
}